

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::GeneratedMessageReflection::HasField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint uVar2;
  LogMessage *other;
  uint uVar3;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"HasField","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"HasField",
               "Field is repeated; the method requires a singular field.");
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    if (this->extensions_offset_ == -1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4ae);
      other = LogMessage::operator<<(&local_60,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_61,other);
      LogMessage::~LogMessage(&local_60);
    }
    bVar1 = ExtensionSet::Has((ExtensionSet *)
                              ((long)&(message->super_MessageLite)._vptr_MessageLite +
                              (long)this->extensions_offset_),*(int *)(field + 0x28));
  }
  else {
    uVar2 = (int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
            -0x11111111;
    uVar3 = uVar2 + 0x1f;
    if (-1 < (int)uVar2) {
      uVar3 = uVar2;
    }
    bVar1 = (*(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (long)((int)uVar3 >> 5) * 4 + (long)this->has_bits_offset_) >> (uVar2 & 0x1f)
            & 1) != 0;
  }
  return bVar1;
}

Assistant:

bool GeneratedMessageReflection::HasField(const Message& message,
                                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(HasField);
  USAGE_CHECK_SINGULAR(HasField);

  if (field->is_extension()) {
    return GetExtensionSet(message).Has(field->number());
  } else {
    return HasBit(message, field);
  }
}